

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

date_t duckdb::DateTrunc::
       UnaryFunction<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::MicrosecondOperator>
                 (timestamp_t input)

{
  bool bVar1;
  timestamp_t in_RDI;
  undefined4 local_4;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(in_RDI);
  if (bVar1) {
    local_4 = MicrosecondOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(in_RDI);
  }
  else {
    local_4 = Cast::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
  }
  return (date_t)local_4;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}